

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void verify_min_dfs(log_multi *b,node *node)

{
  uint uVar1;
  node *pnVar2;
  uint uVar3;
  
  for (; node->internal == true; node = (b->nodes)._begin + node->right) {
    pnVar2 = (b->nodes)._begin;
    uVar1 = pnVar2[node->right].min_count;
    uVar3 = pnVar2[node->left].min_count;
    if (uVar1 < uVar3) {
      uVar3 = uVar1;
    }
    if (node->min_count != uVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"badness! ",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      display_tree_dfs(b,(b->nodes)._begin,0);
    }
    verify_min_dfs(b,(b->nodes)._begin + node->left);
  }
  return;
}

Assistant:

void verify_min_dfs(log_multi& b, const node& node)
{
  if (node.internal)
  {
    if (node.min_count != min_left_right(b, node))
    {
      cout << "badness! " << endl;
      display_tree_dfs(b, b.nodes[0], 0);
    }
    verify_min_dfs(b, b.nodes[node.left]);
    verify_min_dfs(b, b.nodes[node.right]);
  }
}